

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O3

string * __thiscall
Button::writeXml_abi_cxx11_(string *__return_storage_ptr__,Button *this,int indent)

{
  pointer pcVar1;
  char cVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  stringstream str;
  char *local_398;
  long local_390;
  char local_388 [16];
  string local_378;
  undefined1 *local_358 [2];
  undefined1 local_348 [16];
  string local_338;
  undefined1 *local_318 [2];
  undefined1 local_308 [16];
  string local_2f8;
  undefined1 *local_2d8 [2];
  undefined1 local_2c8 [16];
  string local_2b8;
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Util::getIndent_abi_cxx11_(0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_398,local_390);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<Button",7);
  if (local_398 != local_388) {
    operator_delete(local_398);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"isTextButton","");
  Util::writeXmlAttribute<bool>(&local_1d8,(stringstream *)local_1b8,&local_278,this->isTextButton);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"text","");
  pcVar1 = (this->text)._M_dataplus._M_p;
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,pcVar1,pcVar1 + (this->text)._M_string_length);
  Util::writeXmlAttribute<std::__cxx11::string>
            (&local_1f8,(Util *)local_1b8,(stringstream *)local_298,&local_2b8,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if (local_298[0] != local_288) {
    operator_delete(local_298[0]);
  }
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"backgroundNormalImage","");
  pcVar1 = (this->backgroundNormalImage)._M_dataplus._M_p;
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f8,pcVar1,pcVar1 + (this->backgroundNormalImage)._M_string_length);
  Util::writeXmlAttribute<std::__cxx11::string>
            (&local_218,(Util *)local_1b8,(stringstream *)local_2d8,&local_2f8,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if (local_2d8[0] != local_2c8) {
    operator_delete(local_2d8[0]);
  }
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"backgroundPressedImage","");
  pcVar1 = (this->backgroundPressedImage)._M_dataplus._M_p;
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_338,pcVar1,pcVar1 + (this->backgroundPressedImage)._M_string_length);
  Util::writeXmlAttribute<std::__cxx11::string>
            (&local_238,(Util *)local_1b8,(stringstream *)local_318,&local_338,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0]);
  }
  local_358[0] = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"backgroundDisabledImage","");
  pcVar1 = (this->backgroundDisabledImage)._M_dataplus._M_p;
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_378,pcVar1,pcVar1 + (this->backgroundDisabledImage)._M_string_length);
  Util::writeXmlAttribute<std::__cxx11::string>
            (&local_258,(Util *)local_1b8,(stringstream *)local_358,&local_378,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p);
  }
  if (local_358[0] != local_348) {
    operator_delete(local_358[0]);
  }
  Widget::writeXmlAttributes(&this->super_Widget,(stringstream *)local_1b8);
  if ((this->super_Widget).numChildren == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"/>",2);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,">",1);
    cVar2 = (char)(ostream *)local_1a8;
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    Widget::writeXmlChildren(&this->super_Widget,(stringstream *)local_1b8,indent + 1);
    Util::getIndent_abi_cxx11_(0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_398,local_390);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</Button>",9);
    if (local_398 != local_388) {
      operator_delete(local_398);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Button::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<Button";
	Util::writeXmlAttribute(str, "isTextButton", isTextButton);
	Util::writeXmlAttribute(str, "text", text);
	Util::writeXmlAttribute(str, "backgroundNormalImage", backgroundNormalImage);
	Util::writeXmlAttribute(str, "backgroundPressedImage", backgroundPressedImage);
	Util::writeXmlAttribute(str, "backgroundDisabledImage", backgroundDisabledImage);
	writeXmlAttributes(str);

	if (numChildren == 0)
		str << "/>";
	else
	{
		str << ">" << std::endl;

		Widget::writeXmlChildren(str, indent + 1);

		str << Util::getIndent(indent) << "</Button>";
	}

	return str.str();
}